

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O3

void __thiscall
duckdb::DataTable::LocalWALAppend
          (DataTable *this,TableCatalogEntry *table,ClientContext *context,DataChunk *chunk,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *bound_constraints)

{
  TransactionData transaction;
  int iVar1;
  undefined4 extraout_var;
  RowGroupCollection *this_00;
  LocalAppendState append_state;
  LocalAppendState local_138;
  
  TableAppendState::TableAppendState(&local_138.append_state);
  local_138.constraint_state.
  super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t.
  super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>.
  super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>)
       (__uniq_ptr_data<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true,_true>
        )0x0;
  iVar1 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0x10])(table);
  InitializeLocalAppend
            ((DataTable *)CONCAT44(extraout_var,iVar1),&local_138,table,context,bound_constraints);
  LocalAppend((DataTable *)CONCAT44(extraout_var,iVar1),&local_138,context,chunk,true);
  (local_138.storage)->index_append_mode = INSERT_DUPLICATES;
  this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                      (&(local_138.storage)->row_groups);
  transaction.transaction_id = local_138.append_state.transaction.transaction_id;
  transaction.transaction.ptr = local_138.append_state.transaction.transaction.ptr;
  transaction.start_time = local_138.append_state.transaction.start_time;
  RowGroupCollection::FinalizeAppend(this_00,transaction,&local_138.append_state);
  if (local_138.constraint_state.
      super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t.
      super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
      .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true,_true>
       )0x0) {
    operator_delete((void *)local_138.constraint_state.
                            super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
                            .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl);
  }
  local_138.constraint_state.
  super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t.
  super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>.
  super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>)
       (__uniq_ptr_data<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true,_true>
        )0x0;
  TableAppendState::~TableAppendState(&local_138.append_state);
  return;
}

Assistant:

void DataTable::LocalWALAppend(TableCatalogEntry &table, ClientContext &context, DataChunk &chunk,
                               const vector<unique_ptr<BoundConstraint>> &bound_constraints) {
	LocalAppendState append_state;
	auto &storage = table.GetStorage();
	storage.InitializeLocalAppend(append_state, table, context, bound_constraints);

	storage.LocalAppend(append_state, context, chunk, true);
	append_state.storage->index_append_mode = IndexAppendMode::INSERT_DUPLICATES;
	storage.FinalizeLocalAppend(append_state);
}